

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash64.cpp
# Opt level: O2

void MetroHash64::Hash(uint8_t *buffer,uint64_t length,uint8_t *hash,uint64_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 *puVar3;
  undefined1 *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar9 = seed * 0xd6d018f5 + 0x52bc33fedbe4cbb5;
  pauVar8 = (undefined1 (*) [16])buffer;
  if (0x1f < length) {
    auVar2 = vpmovzxdq_avx(ZEXT816(0xa2aa033bd6d018f5));
    auVar1 = vpmovsxdq_avx(ZEXT816(0x30bc5b2962992fc1));
    auVar13 = vpbroadcastq_avx512vl();
    auVar16 = auVar13;
    do {
      auVar14 = vpmullq_avx512vl(auVar2,*pauVar8);
      auVar15 = vpmullq_avx512vl(auVar1,pauVar8[1]);
      pauVar8 = pauVar8 + 2;
      auVar16 = vpaddq_avx(auVar14,auVar16);
      auVar16 = vprolq_avx512vl(auVar16,0x23);
      auVar16 = vpaddq_avx(auVar16,auVar13);
      auVar13 = vpaddq_avx(auVar15,auVar13);
      auVar13 = vprolq_avx512vl(auVar13,0x23);
      auVar13 = vpaddq_avx(auVar13,auVar16);
    } while (pauVar8 <= (undefined1 (*) [16])(buffer + (length - 0x20)));
    uVar10 = vpextrq_avx(auVar13,1);
    uVar11 = auVar16._0_8_;
    uVar7 = vpextrq_avx(auVar16,1);
    uVar6 = (uVar10 + uVar11) * 0xd6d018f5 + uVar7;
    uVar12 = auVar13._0_8_ ^ (uVar6 >> 0x25 | uVar6 * 0x8000000) * 0xa2aa033b;
    uVar6 = (uVar12 + uVar7) * 0xa2aa033b + uVar11;
    uVar10 = (uVar6 >> 0x25 | uVar6 * 0x8000000) * 0xd6d018f5 ^ uVar10;
    uVar6 = (uVar12 + uVar11) * 0xd6d018f5 + uVar10;
    uVar12 = (uVar10 + uVar7) * 0xa2aa033b + uVar12;
    uVar9 = uVar9 + ((uVar6 >> 0x25 | uVar6 * 0x8000000) * 0xa2aa033b ^ uVar11 ^ uVar7 ^
                    (uVar12 >> 0x25 | uVar12 * 0x8000000) * 0xd6d018f5);
  }
  puVar5 = buffer + (length - (long)pauVar8);
  if (0xf < (long)puVar5) {
    puVar3 = *pauVar8;
    puVar4 = *pauVar8;
    pauVar8 = pauVar8 + 1;
    uVar10 = *(long *)puVar3 * 0x62992fc1 + uVar9;
    uVar7 = *(long *)(puVar4 + 8) * 0x62992fc1 + uVar9;
    uVar6 = uVar10 >> 0x1d;
    uVar12 = uVar6 | uVar10 << 0x23;
    uVar10 = uVar7 >> 0x1d;
    uVar11 = uVar10 | uVar7 << 0x23;
    uVar7 = uVar11 * 0x30bc5b29;
    puVar5 = buffer + (length - (long)pauVar8);
    uVar9 = uVar9 + ((uVar10 * 0x7164880000000000 | uVar11 * 0x9472cc564ae2c91 >> 0x15) +
                     ((uVar6 * -0x74e180000000000 | uVar12 * 0x28e511fea41f163d >> 0x15) + uVar7 ^
                     uVar12 * 0x30bc5b29) ^ uVar7);
  }
  if (7 < (long)puVar5) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
    uVar9 = *(long *)puVar3 * 0x30bc5b29 + uVar9;
    uVar9 = (uVar9 >> 0x37 | uVar9 * 0x200) * 0xa2aa033b ^ uVar9;
    puVar5 = buffer + (length - (long)pauVar8);
  }
  if (3 < (long)puVar5) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 4);
    uVar9 = (ulong)*(uint *)puVar3 * 0x30bc5b29 + uVar9;
    uVar9 = (uVar9 >> 0x1a | uVar9 << 0x26) * 0xa2aa033b ^ uVar9;
    puVar5 = buffer + (length - (long)pauVar8);
  }
  if (1 < (long)puVar5) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 2);
    puVar5 = buffer + (length - (long)pauVar8);
    uVar9 = (ulong)*(ushort *)puVar3 * 0x30bc5b29 + uVar9;
    uVar9 = (uVar9 >> 0x30 | uVar9 * 0x10000) * 0xa2aa033b ^ uVar9;
  }
  if (0 < (long)puVar5) {
    uVar9 = (ulong)(byte)(*pauVar8)[0] * 0x30bc5b29 + uVar9;
    uVar9 = (uVar9 >> 0x25 | uVar9 * 0x8000000) * 0xa2aa033b ^ uVar9;
  }
  uVar9 = (uVar9 >> 0x1c | uVar9 << 0x24) ^ uVar9;
  uVar6 = uVar9 * 0xd6d018f5;
  *(ulong *)hash = (uVar9 * -0x497f385800000000 | uVar6 >> 0x1d) ^ uVar6;
  return;
}

Assistant:

void MetroHash64::Hash(const uint8_t * buffer, const uint64_t length, uint8_t * const hash, const uint64_t seed)
{
    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(buffer);
    const uint8_t * const end = ptr + length;

    uint64_t h = (static_cast<uint64_t>(seed) + k2) * k0;

    if (length >= 32)
    {
        uint64_t v[4];
        v[0] = h;
        v[1] = h;
        v[2] = h;
        v[3] = h;

        do
        {
            v[0] += read_u64(ptr) * k0; ptr += 8; v[0] = rotate_right(v[0],29) + v[2];
            v[1] += read_u64(ptr) * k1; ptr += 8; v[1] = rotate_right(v[1],29) + v[3];
            v[2] += read_u64(ptr) * k2; ptr += 8; v[2] = rotate_right(v[2],29) + v[0];
            v[3] += read_u64(ptr) * k3; ptr += 8; v[3] = rotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 37) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 37) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 37) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 37) * k0;
        h += v[0] ^ v[1];
    }

    if ((end - ptr) >= 16)
    {
        uint64_t v0 = h + (read_u64(ptr) * k2); ptr += 8; v0 = rotate_right(v0,29) * k3;
        uint64_t v1 = h + (read_u64(ptr) * k2); ptr += 8; v1 = rotate_right(v1,29) * k3;
        v0 ^= rotate_right(v0 * k0, 21) + v1;
        v1 ^= rotate_right(v1 * k3, 21) + v0;
        h += v1;
    }

    if ((end - ptr) >= 8)
    {
        h += read_u64(ptr) * k3; ptr += 8;
        h ^= rotate_right(h, 55) * k1;
    }

    if ((end - ptr) >= 4)
    {
        h += read_u32(ptr) * k3; ptr += 4;
        h ^= rotate_right(h, 26) * k1;
    }

    if ((end - ptr) >= 2)
    {
        h += read_u16(ptr) * k3; ptr += 2;
        h ^= rotate_right(h, 48) * k1;
    }

    if ((end - ptr) >= 1)
    {
        h += read_u8 (ptr) * k3;
        h ^= rotate_right(h, 37) * k1;
    }

    h ^= rotate_right(h, 28);
    h *= k0;
    h ^= rotate_right(h, 29);

    memcpy(hash, &h, 8);
}